

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void __thiscall ws::Logger::add(Logger *this,Record *record)

{
  Severity SVar1;
  size_t __val;
  type pbVar2;
  Severity severity;
  time_point *now;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  duration local_60;
  undefined1 local_58 [8];
  string time;
  string str;
  Record *record_local;
  Logger *this_local;
  
  SVar1 = Record::get_severity(record);
  if ((int)this->min_severity <= (int)SVar1) {
    std::__cxx11::string::string((string *)(time.field_2._M_local_buf + 8));
    local_60.__r = (rep)Record::get_time_point(record);
    time_to_str_abi_cxx11_((string *)local_58,(ws *)&local_60,now);
    SVar1 = Record::get_severity(record);
    get_severity_str_abi_cxx11_(&local_b0,(ws *)(ulong)SVar1,severity);
    std::operator+(&local_90,&local_b0," ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&time.field_2 + 8),&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58," "
                  );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&time.field_2 + 8),&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    SVar1 = Record::get_severity(record);
    if (SVar1 != INFO) {
      __val = Record::get_thread_id(record);
      std::__cxx11::to_string(&local_110,__val);
      std::operator+(&local_f0,&local_110," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&time.field_2 + 8),&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      Record::get_location_abi_cxx11_(&local_150,record);
      std::operator+(&local_130,&local_150," ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&time.field_2 + 8),&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    Record::get_message_abi_cxx11_(&local_190,record);
    std::operator+(&local_170,&local_190,"\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&time.field_2 + 8),&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    if ((this->mode == file) || (this->mode == file_and_console)) {
      pbVar2 = std::
               unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               ::operator*(&this->os);
      std::operator<<((ostream *)pbVar2,(string *)(time.field_2._M_local_buf + 8));
      std::
      unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::operator->(&this->os);
      std::ostream::flush();
    }
    if ((this->mode == console) || (this->mode == file_and_console)) {
      std::operator<<((ostream *)&std::cout,(string *)(time.field_2._M_local_buf + 8));
      std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
    }
    SVar1 = Record::get_severity(record);
    if (SVar1 == CRITICAL) {
      std::terminate();
    }
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(time.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void add(const Record &record)
    {
      if (record.get_severity() < min_severity) return;
      std::string str;
      std::string time = time_to_str(record.get_time_point());
      str += get_severity_str(record.get_severity()) + " ";
      str += time + " ";
      if (record.get_severity() != Severity::INFO)
      {
        str += std::to_string(record.get_thread_id()) + " ";
        str += record.get_location() + " ";
      }
      str += record.get_message() + "\n";
      
      if (mode == Output::file || mode == Output::file_and_console)
      {
        *os << str;
        os->flush();
      }
      
      if (mode == Output::console || mode == Output::file_and_console)
      {
        std::cout << str;
        std::cout << std::flush;
      }
      
      if (record.get_severity() == Severity::CRITICAL)
      {
        std::terminate();
      }
    }